

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  secp256k1_fe *r_00;
  secp256k1_fe zz;
  secp256k1_fe sStack_48;
  
  secp256k1_fe_impl_sqr(&sStack_48,s);
  secp256k1_fe_impl_mul(&r->x,&r->x,&sStack_48);
  r_00 = &r->y;
  secp256k1_fe_impl_mul(r_00,r_00,&sStack_48);
  secp256k1_fe_impl_mul(r_00,r_00,s);
  secp256k1_fe_impl_mul(&r->z,&r->z,s);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}